

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

sa_family_t __thiscall CService::GetSAFamily(CService *this)

{
  sa_family_t sVar1;
  uint uVar2;
  long in_FS_OFFSET;
  
  uVar2 = (this->super_CNetAddr).m_net - NET_IPV4;
  if (uVar2 < 5) {
    sVar1 = *(sa_family_t *)(&DAT_0088ccb8 + (ulong)uVar2 * 2);
  }
  else {
    sVar1 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return sVar1;
  }
  __stack_chk_fail();
}

Assistant:

sa_family_t CService::GetSAFamily() const
{
    switch (m_net) {
    case NET_IPV4:
        return AF_INET;
    case NET_IPV6:
    case NET_CJDNS:
        return AF_INET6;
    default:
        return AF_UNSPEC;
    }
}